

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

size_type __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
::erase(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
        *this,key_type *key)

{
  iterator pos;
  iterator local_48;
  undefined1 auStack_30 [8];
  iterator it;
  
  find((iterator *)auStack_30,this,key);
  if (auStack_30 != (undefined1  [8])0x0) {
    pos.it_.m_ = (InnerMap *)it.it_.node_;
    pos.it_.node_ = (Node *)auStack_30;
    pos.it_.bucket_index_ = (size_type)it.it_.m_;
    erase(&local_48,this,pos);
  }
  return (ulong)(auStack_30 != (undefined1  [8])0x0);
}

Assistant:

size_type erase(const key_type& key) {
    iterator it = find(key);
    if (it == end()) {
      return 0;
    } else {
      erase(it);
      return 1;
    }
  }